

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data_sorted.c
# Opt level: O2

LY_ERR lyds_additionally_create_rb_tree
                 (lyd_node **first_sibling,lyd_node **leader,lyd_meta *root_meta,rb_node **rbt)

{
  LY_ERR ret__;
  LY_ERR LVar1;
  rb_node *in_RAX;
  rb_node *rbn;
  
  rbn = in_RAX;
  LVar1 = lyds_create_node(*leader,&rbn);
  if (LVar1 == LY_SUCCESS) {
    *rbt = rbn;
    LVar1 = lyds_additionally_create_rb_nodes(first_sibling,leader,root_meta,rbt,(*leader)->next);
    (root_meta->value).field_2.enum_item = (lysc_type_bitenum_item *)*rbt;
  }
  else {
    LVar1 = LY_EMEM;
  }
  return LVar1;
}

Assistant:

static LY_ERR
lyds_additionally_create_rb_tree(struct lyd_node **first_sibling, struct lyd_node **leader,
        struct lyd_meta *root_meta, struct rb_node **rbt)
{
    LY_ERR ret;
    struct rb_node *rbn;

    /* let's begin with the leader */
    ret = lyds_create_node(*leader, &rbn);
    LY_CHECK_RET(ret);
    *rbt = rbn;

    /* continue with the rest of the nodes */
    ret = lyds_additionally_create_rb_nodes(first_sibling, leader, root_meta, rbt, (*leader)->next);

    /* store pointer to the root */
    RBT_SET(root_meta, *rbt);

    return ret;
}